

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.cc
# Opt level: O2

void __thiscall Dir::~Dir(Dir *this)

{
  closedir((DIR *)this->dir_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Dir::~Dir() {
  closedir(dir_);
}